

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties
               (RecyclableObject *object)

{
  bool bVar1;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this;
  Type local_10;
  RecyclableObject *object_local;
  
  local_10.ptr = (GlobalObject *)object;
  RecyclableObject::GetLibrary(object);
  JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
            ((JavascriptLibrary *)&stack0xffffffffffffffe8);
  this = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
         operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                    &stack0xffffffffffffffe8);
  bVar1 = PrototypeChainCache<Js::OnlyWritablePropertyCache>::Check
                    (this,(RecyclableObject *)local_10.ptr);
  return bVar1;
}

Assistant:

bool JavascriptOperators::CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties(_In_ RecyclableObject* object)
    {
        return object->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Check(object);
    }